

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertyParseDump(Scl_Tree_t *p,char *pFileName)

{
  FILE *__stream;
  int iVar1;
  
  __stream = _stdout;
  if ((pFileName == (char *)0x0) || (__stream = fopen(pFileName,"w"), __stream != (FILE *)0x0)) {
    Scl_LibertyParseDumpItem((FILE *)__stream,p,p->pItems,0);
    iVar1 = 1;
    if (__stream != _stdout) {
      fclose(__stream);
    }
  }
  else {
    puts("Scl_LibertyParseDump(): The output file is unavailable (absent or open).");
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Scl_LibertyParseDump( Scl_Tree_t * p, char * pFileName )
{
    FILE * pFile;
    if ( pFileName == NULL )
        pFile = stdout;
    else
    {
        pFile = fopen( pFileName, "w" );
        if ( pFile == NULL )
        {
            printf( "Scl_LibertyParseDump(): The output file is unavailable (absent or open).\n" );
            return 0;
        }
    }
    Scl_LibertyParseDumpItem( pFile, p, Scl_LibertyRoot(p), 0 );
    if ( pFile != stdout )
        fclose( pFile );
    return 1;
}